

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaParams.cpp
# Opt level: O0

char ** __thiscall NaParams::FetchParam(NaParams *this,char *szParamName)

{
  void *pvVar1;
  undefined4 *puVar2;
  long in_RDI;
  char *szParamValue;
  item_t *pit;
  item_t it;
  undefined1 local_20 [8];
  undefined8 local_18;
  
  local_18 = 0;
  pvVar1 = bsearch(local_20,*(void **)(in_RDI + 0x410),(long)*(int *)(in_RDI + 0x418),0x10,
                   stored_cmp);
  if (pvVar1 != (void *)0x0) {
    return (char **)((long)pvVar1 + 8);
  }
  puVar2 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar2 = 0xd;
  __cxa_throw(puVar2,&NaException::typeinfo,0);
}

Assistant:

char*&
NaParams::FetchParam (const char* szParamName)
{
  item_t	it, *pit;
  it.name = (char*)szParamName;
  it.value = NULL;

  const char	*szParamValue = "?not found";

  pit = (item_t*)bsearch(&it, storage, stored_n, sizeof(item_t), stored_cmp);
  if(NULL != pit)
    return pit->value;

  throw(na_not_found);
}